

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O0

char * VW::are_features_compatible(vw *vw1,vw *vw2)

{
  bool bVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  size_type sVar4;
  long in_RSI;
  long in_RDI;
  iterator j;
  iterator i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  reference in_stack_ffffffffffffffa0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_ffffffffffffffc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  long local_18;
  long local_10;
  char *local_8;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x200) == *(long *)(*(long *)(in_RSI + 8) + 0x200)) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    bVar1 = std::equal<bool*,bool*>
                      ((bool *)in_stack_ffffffffffffffa0,(bool *)in_stack_ffffffffffffff98,
                       (bool *)0x133ed1);
    if (bVar1) {
      bVar1 = std::equal<unsigned_long*,unsigned_long*>
                        ((unsigned_long *)in_stack_ffffffffffffffa0,
                         (unsigned_long *)in_stack_ffffffffffffff98,(unsigned_long *)0x133f16);
      if (bVar1) {
        bVar1 = std::equal<unsigned_int*,unsigned_int*>
                          ((uint *)in_stack_ffffffffffffffa0,(uint *)in_stack_ffffffffffffff98,
                           (uint *)0x133f5b);
        if (bVar1) {
          bVar1 = std::equal<unsigned_int*,unsigned_int*>
                            ((uint *)in_stack_ffffffffffffffa0,(uint *)in_stack_ffffffffffffff98,
                             (uint *)0x133fa0);
          if (bVar1) {
            bVar1 = std::equal<unsigned_int*,unsigned_int*>
                              ((uint *)in_stack_ffffffffffffffa0,(uint *)in_stack_ffffffffffffff98,
                               (uint *)0x133fe5);
            if (bVar1) {
              if (*(int *)(local_10 + 0x50) == *(int *)(local_18 + 0x50)) {
                if ((*(byte *)(local_10 + 0x360) & 1) == (*(byte *)(local_18 + 0x360) & 1)) {
                  __first2._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(local_10 + 0x368));
                  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)(local_18 + 0x368));
                  if (__first2._M_current == pbVar2) {
                    if ((*(byte *)(local_10 + 0x3b0) & 1) == (*(byte *)(local_18 + 0x3b0) & 1)) {
                      if (((*(byte *)(local_10 + 0x3b0) & 1) != 0) &&
                         (bVar1 = std::equal<bool*,bool*>
                                            ((bool *)in_stack_ffffffffffffffa0,
                                             (bool *)in_stack_ffffffffffffff98,(bool *)0x13410c),
                         !bVar1)) {
                        return "ignore";
                      }
                      if ((*(byte *)(local_10 + 0x4b1) & 1) == (*(byte *)(local_18 + 0x4b1) & 1)) {
                        if (((*(byte *)(local_10 + 0x4b1) & 1) != 0) &&
                           (bVar1 = std::equal<bool*,bool*>
                                              ((bool *)in_stack_ffffffffffffffa0,
                                               (bool *)in_stack_ffffffffffffff98,(bool *)0x134195),
                           !bVar1)) {
                          return "ignore_linear";
                        }
                        if ((*(byte *)(local_10 + 0x5b2) & 1) == (*(byte *)(local_18 + 0x5b2) & 1))
                        {
                          if (((*(byte *)(local_10 + 0x5b2) & 1) != 0) &&
                             (bVar1 = std::equal<unsigned_char*,unsigned_char*>
                                                ((uchar *)in_stack_ffffffffffffffa0,
                                                 (uchar *)in_stack_ffffffffffffff98,
                                                 (uchar *)0x13421e), !bVar1)) {
                            return "redefine";
                          }
                          if ((*(byte *)(local_10 + 0x3454) & 1) ==
                              (*(byte *)(local_18 + 0x3454) & 1)) {
                            sVar3 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)(local_10 + 0x1c00));
                            sVar4 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)(local_18 + 0x1c00));
                            if (sVar3 == sVar4) {
                              local_20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffff98);
                              local_28 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffff98);
                              local_30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)in_stack_ffffffffffffff98);
                              bVar1 = std::
                                      equal<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                                                 ,__first2);
                              if (((bVar1 ^ 0xffU) & 1) == 0) {
                                local_38._M_current =
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)std::
                                        begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                                  (in_stack_ffffffffffffff98);
                                std::
                                begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)in_stack_ffffffffffffff98);
                                while( true ) {
                                  std::
                                  end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)in_stack_ffffffffffffff98);
                                  bVar1 = __gnu_cxx::operator!=
                                                    ((
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffffa0,
                                                  (
                                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  *)in_stack_ffffffffffffff98);
                                  if (!bVar1) break;
                                  in_stack_ffffffffffffffa0 =
                                       __gnu_cxx::
                                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ::operator*(&local_38);
                                  __gnu_cxx::
                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&stack0xffffffffffffffc0);
                                  bVar1 = std::operator!=(in_stack_ffffffffffffffa0,
                                                          in_stack_ffffffffffffff98);
                                  if (bVar1) {
                                    return "interaction mismatch";
                                  }
                                  __gnu_cxx::
                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator++(&local_38);
                                  __gnu_cxx::
                                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&stack0xffffffffffffffc0);
                                }
                                local_8 = (char *)0x0;
                              }
                              else {
                                local_8 = "dictionary_path";
                              }
                            }
                            else {
                              local_8 = "dictionary_path size";
                            }
                          }
                          else {
                            local_8 = "add_constant";
                          }
                        }
                        else {
                          local_8 = "redefine_some";
                        }
                      }
                      else {
                        local_8 = "ignore_some_linear";
                      }
                    }
                    else {
                      local_8 = "ignore_some";
                    }
                  }
                  else {
                    local_8 = "interactions size";
                  }
                }
                else {
                  local_8 = "permutations";
                }
              }
              else {
                local_8 = "num_bits";
              }
            }
            else {
              local_8 = "limit";
            }
          }
          else {
            local_8 = "skips";
          }
        }
        else {
          local_8 = "ngram";
        }
      }
      else {
        local_8 = "affix_features";
      }
    }
    else {
      local_8 = "spelling_features";
    }
  }
  else {
    local_8 = "hasher";
  }
  return local_8;
}

Assistant:

const char* are_features_compatible(vw& vw1, vw& vw2)
{
  if (vw1.p->hasher != vw2.p->hasher)
    return "hasher";

  if (!equal(vw1.spelling_features, vw1.spelling_features + (sizeof(vw1.spelling_features) / sizeof(bool)),
          vw2.spelling_features))
    return "spelling_features";

  if (!equal(
          vw1.affix_features, vw1.affix_features + (sizeof(vw1.affix_features) / sizeof(uint32_t)), vw2.affix_features))
    return "affix_features";

  if (!equal(vw1.ngram, vw1.ngram + (sizeof(vw1.ngram) / sizeof(uint32_t)), vw2.ngram))
    return "ngram";

  if (!equal(vw1.skips, vw1.skips + (sizeof(vw1.skips) / sizeof(uint32_t)), vw2.skips))
    return "skips";

  if (!equal(vw1.limit, vw1.limit + (sizeof(vw1.limit) / sizeof(uint32_t)), vw2.limit))
    return "limit";

  if (vw1.num_bits != vw2.num_bits)
    return "num_bits";

  if (vw1.permutations != vw2.permutations)
    return "permutations";

  if (vw1.interactions.size() != vw2.interactions.size())
    return "interactions size";

  if (vw1.ignore_some != vw2.ignore_some)
    return "ignore_some";

  if (vw1.ignore_some && !equal(vw1.ignore, vw1.ignore + (sizeof(vw1.ignore) / sizeof(bool)), vw2.ignore))
    return "ignore";

  if (vw1.ignore_some_linear != vw2.ignore_some_linear)
    return "ignore_some_linear";

  if (vw1.ignore_some_linear &&
      !equal(vw1.ignore_linear, vw1.ignore_linear + (sizeof(vw1.ignore_linear) / sizeof(bool)), vw2.ignore_linear))
    return "ignore_linear";

  if (vw1.redefine_some != vw2.redefine_some)
    return "redefine_some";

  if (vw1.redefine_some &&
      !equal(vw1.redefine, vw1.redefine + (sizeof(vw1.redefine) / sizeof(unsigned char)), vw2.redefine))
    return "redefine";

  if (vw1.add_constant != vw2.add_constant)
    return "add_constant";

  if (vw1.dictionary_path.size() != vw2.dictionary_path.size())
    return "dictionary_path size";

  if (!equal(vw1.dictionary_path.begin(), vw1.dictionary_path.end(), vw2.dictionary_path.begin()))
    return "dictionary_path";

  for (auto i = std::begin(vw1.interactions), j = std::begin(vw2.interactions); i != std::end(vw1.interactions);
       ++i, ++j)
    if (*i != *j)
      return "interaction mismatch";

  return nullptr;
}